

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O2

void completeHessianDiagonal(HighsOptions *options,HighsHessian *hessian)

{
  pointer piVar1;
  pointer piVar2;
  pointer pdVar3;
  pointer piVar4;
  pointer pdVar5;
  uint uVar6;
  HighsInt HVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  long lVar15;
  long lVar16;
  int iVar17;
  
  uVar12 = hessian->dim_;
  uVar6 = HighsHessian::numNz(hessian);
  uVar11 = 0;
  uVar13 = 0;
  if (0 < (int)uVar12) {
    uVar13 = (ulong)uVar12;
  }
  uVar9 = 0;
  for (; uVar13 != uVar11; uVar11 = uVar11 + 1) {
    iVar8 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11];
    uVar14 = 1;
    if (iVar8 < (int)uVar6) {
      uVar14 = (uint)(uVar11 !=
                     (uint)(hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[iVar8]);
    }
    uVar9 = uVar9 + uVar14;
  }
  highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros onto the diagonal\n",
              (ulong)uVar12,(ulong)uVar6,(ulong)uVar9);
  if (uVar9 != 0) {
    HVar7 = HighsHessian::numNz(hessian);
    uVar9 = HVar7 + uVar9;
    uVar11 = (ulong)uVar9;
    std::vector<int,_std::allocator<int>_>::resize(&hessian->index_,(long)(int)uVar9);
    std::vector<double,_std::allocator<double>_>::resize(&hessian->value_,(long)(int)uVar9);
    iVar8 = HighsHessian::numNz(hessian);
    piVar1 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar1[(int)uVar12] = uVar9;
    piVar2 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    while (0 < (int)uVar12) {
      uVar12 = uVar12 - 1;
      piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar17 = (int)uVar11;
      lVar16 = (long)iVar8;
      lVar15 = 0;
      while( true ) {
        lVar10 = (long)piVar1[uVar12];
        if (lVar16 + -1 + lVar15 <= lVar10) break;
        piVar4[(long)iVar17 + lVar15 + -1] = piVar4[lVar16 + lVar15 + -1];
        pdVar5[(long)iVar17 + lVar15 + -1] = pdVar5[lVar16 + lVar15 + -1];
        lVar15 = lVar15 + -1;
      }
      if (piVar1[uVar12] < iVar8) {
        uVar11 = (ulong)(iVar17 - 1) + lVar15;
        uVar6 = piVar2[lVar10];
        iVar17 = (int)uVar11;
        piVar2[iVar17] = uVar6;
        pdVar3[iVar17] = pdVar3[lVar10];
        if (uVar6 != uVar12) goto LAB_002f0191;
      }
      else {
        iVar17 = iVar17 + (int)lVar15;
LAB_002f0191:
        uVar11 = (ulong)(iVar17 - 1);
        piVar2[(long)iVar17 + -1] = uVar12;
        pdVar3[(long)iVar17 + -1] = 0.0;
      }
      iVar8 = piVar1[uVar12];
      piVar1[uVar12] = (int)uVar11;
    }
  }
  return;
}

Assistant:

void completeHessianDiagonal(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Count the number of missing diagonal entries
  HighsInt num_missing_diagonal_entries = 0;
  const HighsInt dim = hessian.dim_;
  const HighsInt num_nz = hessian.numNz();
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    if (iEl < num_nz) {
      if (hessian.index_[iEl] != iCol) num_missing_diagonal_entries++;
    } else {
      num_missing_diagonal_entries++;
    }
  }
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros "
              "onto the diagonal\n",
              (int)dim, (int)num_nz, (int)num_missing_diagonal_entries);
  assert(num_missing_diagonal_entries >= dim - num_nz);
  if (!num_missing_diagonal_entries) return;
  // There are missing diagonal entries to be inserted as explicit zeros
  const HighsInt new_num_nz = hessian.numNz() + num_missing_diagonal_entries;
  HighsInt to_iEl = new_num_nz;
  hessian.index_.resize(new_num_nz);
  hessian.value_.resize(new_num_nz);
  HighsInt next_start = hessian.numNz();
  hessian.start_[dim] = to_iEl;
  HighsInt num_missing_diagonal_entries_added = 0;
  for (HighsInt iCol = dim - 1; iCol >= 0; iCol--) {
    // Shift the entries that are sure to be off-diagonal
    for (HighsInt iEl = next_start - 1; iEl > hessian.start_[iCol]; iEl--) {
      assert(hessian.index_[iEl] != iCol);
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
    }
    // Now consider any first entry. If there is none, or if it's not
    // the diagonal, then there is no diagonal entry for this column
    bool no_diagonal_entry;
    if (hessian.start_[iCol] < next_start) {
      const HighsInt iEl = hessian.start_[iCol];
      // Copy the first entry
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
      // If the first entry isn't the diagonal, then there is no
      // diagonal entry for this column
      no_diagonal_entry = hessian.index_[iEl] != iCol;
    } else {
      no_diagonal_entry = true;
    }
    if (no_diagonal_entry) {
      // There is no diagonal entry, so have insert an explicit zero
      to_iEl--;
      hessian.index_[to_iEl] = iCol;
      hessian.value_[to_iEl] = 0;
      num_missing_diagonal_entries_added++;
      assert(num_missing_diagonal_entries_added <=
             num_missing_diagonal_entries);
    }
    next_start = hessian.start_[iCol];
    hessian.start_[iCol] = to_iEl;
  }
  assert(to_iEl == 0);
}